

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

GLFWwindow * __thiscall
embree::TutorialApplication::createFullScreenWindow(TutorialApplication *this)

{
  GLFWmonitor *handle;
  GLFWvidmode *pGVar1;
  GLFWwindow *pGVar2;
  
  handle = glfwGetPrimaryMonitor();
  pGVar1 = glfwGetVideoMode(handle);
  glfwWindowHint(0x21001,pGVar1->redBits);
  glfwWindowHint(0x21002,pGVar1->greenBits);
  glfwWindowHint(0x21003,pGVar1->blueBits);
  glfwWindowHint(0x2100f,pGVar1->refreshRate);
  pGVar2 = glfwCreateWindow(pGVar1->width,pGVar1->height,(this->tutorialName)._M_dataplus._M_p,
                            handle,(GLFWwindow *)0x0);
  resize(this,pGVar1->width,pGVar1->height);
  return pGVar2;
}

Assistant:

GLFWwindow* TutorialApplication::createFullScreenWindow()
  {
    GLFWmonitor* monitor = glfwGetPrimaryMonitor();
    const GLFWvidmode* mode = glfwGetVideoMode(monitor);
    glfwWindowHint(GLFW_RED_BITS,mode->redBits);
    glfwWindowHint(GLFW_GREEN_BITS,mode->greenBits);
    glfwWindowHint(GLFW_BLUE_BITS,mode->blueBits);
    glfwWindowHint(GLFW_REFRESH_RATE,mode->refreshRate);
    GLFWwindow* window = glfwCreateWindow(mode->width,mode->height,tutorialName.c_str(),monitor,nullptr);
    resize(mode->width,mode->height);
    return window;
  }